

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void LargeIntRegMultiply<long,_unsigned_int>::
     RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int64_t *a,uint32_t b,int64_t *pRet)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *a;
  lVar2 = lVar1 * (ulong)b;
  lVar3 = SUB168(SEXT816(lVar1) * SEXT816((long)(ulong)b),8);
  *pRet = lVar2;
  if (lVar1 < 0) {
    if (lVar3 == -1 && lVar2 < 0) {
      return;
    }
    if (lVar3 == 0 && lVar2 == 0) {
      return;
    }
  }
  else if ((lVar3 == 0) && (-1 < lVar2)) {
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void RegMultiplyThrow( const std::int64_t& a, std::uint32_t b, std::int64_t* pRet ) SAFEINT_CPP_THROW
    {
#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        if( !MultiplyInt64( a, (std::int64_t)b, pRet ) )
            E::SafeIntOnOverflow();
#else
        bool aNegative = false;
        std::uint64_t tmp = 0;
        std::int64_t a1 = a;

        if( a1 < 0 )
        {
            aNegative = true;
            a1 = (std::int64_t)AbsValueHelper< std::int64_t, GetAbsMethod< std::int64_t >::method >::Abs(a1);
        }

        LargeIntRegMultiply< std::uint64_t, std::uint32_t >::template RegMultiplyThrow< E >( (std::uint64_t)a1, b, &tmp );

        // The unsigned multiplication didn't overflow
        if( aNegative )
        {
            // Result must be negative
            if( tmp <= (std::uint64_t)std::numeric_limits< std::int64_t >::min() )
            {
                *pRet = SignedNegation< std::int64_t >::Value( tmp );
                return;
            }
        }
        else
        {
            // Result must be positive
            if( tmp <= (std::uint64_t)std::numeric_limits<std::int64_t>::max() )
            {
                *pRet = (std::int64_t)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
#endif
    }